

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.hpp
# Opt level: O2

Data2D<float> * __thiscall
TasGrid::GridLocalPolynomial::encodeSupportForGPU<1,(TasGrid::TypeOneDRule)38,float>
          (Data2D<float> *__return_storage_ptr__,GridLocalPolynomial *this,MultiIndexSet *work)

{
  size_t sVar1;
  pointer pfVar2;
  size_t sVar3;
  pointer piVar4;
  long lVar5;
  long lVar6;
  int i;
  long lVar7;
  double dVar8;
  
  Data2D<float>::Data2D<int,int>
            (__return_storage_ptr__,(this->super_BaseCanonicalGrid).num_dimensions,
             work->cache_num_indexes);
  lVar6 = 0;
  for (lVar7 = 0; lVar7 < work->cache_num_indexes; lVar7 = lVar7 + 1) {
    sVar1 = __return_storage_ptr__->stride;
    pfVar2 = (__return_storage_ptr__->vec).super__Vector_base<float,_std::allocator<float>_>._M_impl
             .super__Vector_impl_data._M_start;
    sVar3 = work->num_dimensions;
    piVar4 = (work->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar5 = 0; lVar5 < (this->super_BaseCanonicalGrid).num_dimensions; lVar5 = lVar5 + 1) {
      dVar8 = RuleLocal::getSupport<(TasGrid::RuleLocal::erule)3>
                        (*(int *)((long)piVar4 + lVar5 * 4 + sVar3 * lVar6));
      *(float *)((long)pfVar2 + lVar5 * 4 + sVar1 * lVar6) = (float)dVar8;
    }
    lVar6 = lVar6 + 4;
  }
  return __return_storage_ptr__;
}

Assistant:

Data2D<T> encodeSupportForGPU(const MultiIndexSet &work) const{
        Data2D<T> cpu_support(num_dimensions, work.getNumIndexes());
        for(int i=0; i<work.getNumIndexes(); i++){
            const int* p = work.getIndex(i);
            T *s = cpu_support.getStrip(i);
            for(int j=0; j<num_dimensions; j++){
                if (ord == 0){
                    s[j] = static_cast<T>(RuleLocal::getSupport<RuleLocal::erule::pwc>(p[j]));
                } else {
                    switch(crule) {
                        case rule_localp:
                            s[j] = static_cast<T>(RuleLocal::getSupport<RuleLocal::erule::localp>(p[j]));
                            break;
                        case rule_semilocalp:
                            s[j] = static_cast<T>(RuleLocal::getSupport<RuleLocal::erule::semilocalp>(p[j]));
                            break;
                        case rule_localp0:
                            s[j] = static_cast<T>(RuleLocal::getSupport<RuleLocal::erule::localp0>(p[j]));
                            break;
                        case rule_localpb:
                            s[j] = static_cast<T>(RuleLocal::getSupport<RuleLocal::erule::localpb>(p[j]));
                            break;
                    };
                    if (ord == 2) s[j] *= s[j];
                    if ((crule == rule_localp) || (crule == rule_semilocalp)) if (p[j] == 0) s[j] = static_cast<T>(-1.0); // constant function
                    if ((crule == rule_localp) && (ord == 2)){
                        if (p[j] == 1) s[j] = static_cast<T>(-2.0);
                        else if (p[j] == 2) s[j] = static_cast<T>(-3.0);
                    }
                    if ((crule == rule_semilocalp) && (ord == 2)){
                        if (p[j] == 1) s[j] = static_cast<T>(-4.0);
                        else if (p[j] == 2) s[j] = static_cast<T>(-5.0);
                    }
                    if ((crule == rule_localpb) && (ord == 2)){
                        if (p[j] < 2) s[j] = static_cast<T>(-2.0); // linear functions on level 0
                    }
                }
            }
        }
        return cpu_support;
    }